

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::LogicalOrExp(SQCompiler *this)

{
  SQUnsignedInteger SVar1;
  SQFuncState *pSVar2;
  SQInteger SVar3;
  bool bVar4;
  undefined7 uVar5;
  SQInteger SVar6;
  SQInteger arg0;
  SQExpState es;
  
  LogicalAndExp(this);
  if (this->_token == 0x10f) {
    SVar6 = SQFuncState::PopTarget(this->_fs);
    arg0 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(this->_fs,_OP_OR,arg0,0,SVar6,0);
    SVar1 = (this->_fs->_instructions)._size;
    if (arg0 != SVar6) {
      SQFuncState::AddInstruction(this->_fs,_OP_MOVE,arg0,SVar6,0,0);
    }
    Lex(this);
    bVar4 = (this->_es).donot_get;
    uVar5 = *(undefined7 *)&(this->_es).field_0x11;
    SVar6 = (this->_es).etype;
    SVar3 = (this->_es).epos;
    (this->_es).etype = 1;
    (this->_es).epos = -1;
    (this->_es).donot_get = false;
    LogicalOrExp(this);
    (this->_es).donot_get = bVar4;
    *(undefined7 *)&(this->_es).field_0x11 = uVar5;
    (this->_es).etype = SVar6;
    (this->_es).epos = SVar3;
    pSVar2 = this->_fs;
    pSVar2->_optimization = false;
    SVar6 = SQFuncState::PopTarget(pSVar2);
    if (arg0 != SVar6) {
      SQFuncState::AddInstruction(this->_fs,_OP_MOVE,arg0,SVar6,0,0);
    }
    pSVar2 = this->_fs;
    pSVar2->_optimization = false;
    SQFuncState::SetInstructionParam(pSVar2,SVar1 - 1,1,(pSVar2->_instructions)._size - SVar1);
    (this->_es).etype = 1;
  }
  return;
}

Assistant:

void LogicalOrExp()
    {
        LogicalAndExp();
        for(;;) if(_token == TK_OR) {
            SQInteger first_exp = _fs->PopTarget();
            SQInteger trg = _fs->PushTarget();
            _fs->AddInstruction(_OP_OR, trg, 0, first_exp, 0);
            SQInteger jpos = _fs->GetCurrentPos();
            if(trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
            Lex(); INVOKE_EXP(&SQCompiler::LogicalOrExp);
            _fs->SnoozeOpt();
            SQInteger second_exp = _fs->PopTarget();
            if(trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);
            _fs->SnoozeOpt();
            _fs->SetInstructionParam(jpos, 1, (_fs->GetCurrentPos() - jpos));
            _es.etype = EXPR;
            break;
        }else return;
    }